

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,Context *context,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *shaderOp,ShaderDataSpec *spec)

{
  undefined3 uVar1;
  int iVar2;
  int resultScalarSize;
  undefined4 extraout_var;
  long lVar3;
  ShaderDataSpec *pSVar4;
  ShaderDataSpec *pSVar5;
  byte bVar6;
  
  bVar6 = 0;
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_01e24290;
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,caseName,description,isVertexCase,
             &(this->m_evaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_01e24290;
  pSVar4 = spec;
  pSVar5 = &this->m_spec;
  for (lVar3 = 0x1a; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined3 *)&(pSVar4->resultScale).field_0x1;
    (pSVar5->resultScale).m_isConstant = (pSVar4->resultScale).m_isConstant;
    *(undefined3 *)&(pSVar5->resultScale).field_0x1 = uVar1;
    pSVar4 = (ShaderDataSpec *)((long)pSVar4 + ((ulong)bVar6 * -2 + 1) * 4);
    pSVar5 = (ShaderDataSpec *)((long)pSVar5 + ((ulong)bVar6 * -2 + 1) * 4);
  }
  std::__cxx11::string::string((string *)&this->m_shaderOp,(string *)shaderOp);
  iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  resultScalarSize = glu::getDataTypeScalarSize(spec->output);
  OperatorShaderEvaluator::OperatorShaderEvaluator
            (&this->m_evaluator,(Functions *)CONCAT44(extraout_var,iVar2),(uint)!isVertexCase,
             evalFunc,&spec->referenceScale,&spec->referenceBias,resultScalarSize);
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const string& shaderOp, const ShaderDataSpec& spec)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), caseName, description, isVertexCase, m_evaluator)
	, m_spec			(spec)
	, m_shaderOp		(shaderOp)
	, m_evaluator		(m_renderCtx.getFunctions(), isVertexCase ? SHADERTYPE_VERTEX : SHADERTYPE_FRAGMENT, evalFunc, spec.referenceScale, spec.referenceBias, getDataTypeScalarSize(spec.output))
{
}